

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

_Bool Curl_pipeline_server_blacklisted(Curl_easy *handle,char *server_name)

{
  int iVar1;
  curl_llist *pcVar2;
  size_t max;
  blacklist_node *bl;
  curl_llist_element *e;
  curl_llist *list;
  char *server_name_local;
  Curl_easy *handle_local;
  
  if ((handle->multi != (Curl_multi *)0x0) && (server_name != (char *)0x0)) {
    pcVar2 = Curl_multi_pipelining_server_bl(handle->multi);
    for (bl = (blacklist_node *)pcVar2->head; bl != (blacklist_node *)0x0;
        bl = (blacklist_node *)(bl->list).next) {
      max = strlen(bl->server_name);
      iVar1 = Curl_strncasecompare(bl->server_name,server_name,max);
      if (iVar1 != 0) {
        Curl_infof(handle,"Server %s is blacklisted\n",server_name);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Curl_pipeline_server_blacklisted(struct Curl_easy *handle,
                                      char *server_name)
{
  if(handle->multi && server_name) {
    struct curl_llist *list =
      Curl_multi_pipelining_server_bl(handle->multi);

    struct curl_llist_element *e = list->head;
    while(e) {
      struct blacklist_node *bl = (struct blacklist_node *)e;
      if(strncasecompare(bl->server_name, server_name,
                         strlen(bl->server_name))) {
        infof(handle, "Server %s is blacklisted\n", server_name);
        return TRUE;
      }
      e = e->next;
    }

    DEBUGF(infof(handle, "Server %s is not blacklisted\n", server_name));
  }
  return FALSE;
}